

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

void lcg_pick(int n,int k,int *out,uint *seed)

{
  long in_RDX;
  int in_ESI;
  int j;
  int v;
  int i;
  uint32_t in_stack_ffffffffffffffdc;
  uint32_t in_stack_ffffffffffffffe0;
  int iVar1;
  
  iVar1 = 0;
LAB_003ad20e:
  if (in_ESI <= iVar1) {
    return;
  }
  do {
    in_stack_ffffffffffffffe0 =
         lcg_randint((uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc
                    );
    in_stack_ffffffffffffffdc = 0;
    while( true ) {
      if (iVar1 <= (int)in_stack_ffffffffffffffdc) {
        *(uint32_t *)(in_RDX + (long)iVar1 * 4) = in_stack_ffffffffffffffe0;
        iVar1 = iVar1 + 1;
        goto LAB_003ad20e;
      }
      if (in_stack_ffffffffffffffe0 ==
          *(uint32_t *)(in_RDX + (long)(int)in_stack_ffffffffffffffdc * 4)) break;
      in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1;
    }
  } while( true );
}

Assistant:

static inline void lcg_pick(int n, int k, int *out, unsigned int *seed) {
  assert(0 <= k && k <= n);
  for (int i = 0; i < k; i++) {
    int v;

  // Inner resampling loop
  // We have to use a goto here because C does not have a multi-level continue
  // statement
  resample:
    v = (int)lcg_randint(seed, n);
    for (int j = 0; j < i; j++) {
      if (v == out[j]) {
        // Repeated v, resample
        goto resample;
      }
    }

    // New v, accept
    out[i] = v;
  }
}